

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O2

bool tinyusdz::prim::ReconstructPrim<tinyusdz::RectLight>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,RectLight *light,
               string *warn,string *err,PrimReconstructOptions *options)

{
  uint uVar1;
  Property *prop;
  bool bVar2;
  __type _Var3;
  ostream *poVar4;
  size_type sVar5;
  mapped_type *this;
  _Rb_tree_node_base *p_Var6;
  Property *args;
  _Rb_tree_node_base *p_Var7;
  char *pcVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  string *psVar9;
  int iVar10;
  allocator local_3b1;
  string *local_3b0;
  _Rb_tree_node_base *local_3a8;
  string *local_3a0;
  undefined4 local_394;
  ParseResult ret;
  string local_368;
  TypedAttributeWithFallback<tinyusdz::Purpose> *local_348;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *local_340;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  ostringstream ss_e;
  code *local_298 [45];
  _Any_data local_130;
  code *local_120;
  _Any_data local_110;
  code *local_100;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &table._M_t._M_impl.super__Rb_tree_header._M_header;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar2 = ReconstructXformOpsFromProperties
                    (spec,&table,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)properties,
                     (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)light,err);
  if (bVar2) {
    p_Var6 = (_Rb_tree_node_base *)&(light->super_BoundableLight).purpose;
    local_340 = &(light->super_BoundableLight).visibility;
    p_Var7 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_3b0 = err;
    local_3a0 = warn;
    local_348 = (TypedAttributeWithFallback<tinyusdz::Purpose> *)p_Var6;
    while( true ) {
      name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss_e;
      bVar2 = (_Rb_tree_header *)p_Var7 == &(properties->_M_t)._M_impl.super__Rb_tree_header;
      local_394 = (undefined4)CONCAT71((int7)((ulong)p_Var6 >> 8),bVar2);
      if (bVar2) break;
      p_Var6 = p_Var7 + 1;
      ::std::__cxx11::string::string((string *)&local_50,(string *)p_Var6);
      prop = (Property *)(p_Var7 + 2);
      ::std::__cxx11::string::string((string *)name,"inputs:texture:file",(allocator *)&local_368);
      anon_unknown_0::ParseTypedAttribute<tinyusdz::value::AssetPath>
                (&ret,&table,&local_50,prop,name,&light->file);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar10 = 0;
      if ((ret.code & ~AlreadyProcessed) == Success) {
        bVar2 = false;
        iVar10 = 3;
      }
      else {
        bVar2 = true;
        if (ret.code != Unmatched) {
          local_3a8 = p_Var7;
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xcb2);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_2c8,"Parsing attribute `{}` failed. Error: {}",&local_3b1);
          fmt::format<char[20],std::__cxx11::string>
                    (&local_368,(fmt *)&local_2c8,(string *)"inputs:texture:file",
                     (char (*) [20])&ret.err,name);
          poVar4 = ::std::operator<<((ostream *)&ss_e,(string *)&local_368);
          ::std::operator<<(poVar4,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          psVar9 = local_3b0;
          if (local_3b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+(&local_368,&local_2c8,psVar9);
            ::std::__cxx11::string::operator=((string *)psVar9,(string *)&local_368);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          bVar2 = false;
          iVar10 = 1;
          p_Var7 = local_3a8;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (bVar2) {
        ::std::__cxx11::string::string((string *)&local_70,(string *)p_Var6);
        psVar9 = (string *)&ss_e;
        ::std::__cxx11::string::string((string *)psVar9,"inputs:color",(allocator *)&local_368);
        anon_unknown_0::ParseTypedAttribute<tinyusdz::value::color3f>
                  (&ret,&table,&local_70,prop,psVar9,&(light->super_BoundableLight).color);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar10 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          bVar2 = false;
          iVar10 = 3;
        }
        else {
          bVar2 = true;
          if (ret.code != Unmatched) {
            local_3a8 = p_Var7;
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar4 = ::std::operator<<(poVar4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar4 = ::std::operator<<(poVar4,":");
            poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
            poVar4 = ::std::operator<<(poVar4,"():");
            poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xcb3);
            ::std::operator<<(poVar4," ");
            ::std::__cxx11::string::string
                      ((string *)&local_2c8,"Parsing attribute `{}` failed. Error: {}",&local_3b1);
            fmt::format<char[13],std::__cxx11::string>
                      (&local_368,(fmt *)&local_2c8,(string *)"inputs:color",(char (*) [13])&ret.err
                       ,psVar9);
            poVar4 = ::std::operator<<((ostream *)&ss_e,(string *)&local_368);
            ::std::operator<<(poVar4,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            psVar9 = local_3b0;
            if (local_3b0 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+(&local_368,&local_2c8,psVar9);
              ::std::__cxx11::string::operator=((string *)psVar9,(string *)&local_368);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            bVar2 = false;
            iVar10 = 1;
            p_Var7 = local_3a8;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar2) goto LAB_001b8e39;
        ::std::__cxx11::string::string((string *)&local_90,(string *)p_Var6);
        psVar9 = (string *)&ss_e;
        ::std::__cxx11::string::string((string *)psVar9,"inputs:height",(allocator *)&local_368);
        anon_unknown_0::ParseTypedAttribute<float>(&ret,&table,&local_90,prop,psVar9,&light->height)
        ;
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar10 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          bVar2 = false;
          iVar10 = 3;
        }
        else {
          bVar2 = true;
          if (ret.code != Unmatched) {
            local_3a8 = p_Var7;
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar4 = ::std::operator<<(poVar4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar4 = ::std::operator<<(poVar4,":");
            poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
            poVar4 = ::std::operator<<(poVar4,"():");
            poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xcb4);
            ::std::operator<<(poVar4," ");
            ::std::__cxx11::string::string
                      ((string *)&local_2c8,"Parsing attribute `{}` failed. Error: {}",&local_3b1);
            fmt::format<char[14],std::__cxx11::string>
                      (&local_368,(fmt *)&local_2c8,(string *)"inputs:height",
                       (char (*) [14])&ret.err,psVar9);
            poVar4 = ::std::operator<<((ostream *)&ss_e,(string *)&local_368);
            ::std::operator<<(poVar4,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            psVar9 = local_3b0;
            if (local_3b0 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+(&local_368,&local_2c8,psVar9);
              ::std::__cxx11::string::operator=((string *)psVar9,(string *)&local_368);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            bVar2 = false;
            iVar10 = 1;
            p_Var7 = local_3a8;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar2) goto LAB_001b8e39;
        ::std::__cxx11::string::string((string *)&local_b0,(string *)p_Var6);
        psVar9 = (string *)&ss_e;
        ::std::__cxx11::string::string((string *)psVar9,"inputs:width",(allocator *)&local_368);
        anon_unknown_0::ParseTypedAttribute<float>(&ret,&table,&local_b0,prop,psVar9,&light->width);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar10 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          bVar2 = false;
          iVar10 = 3;
        }
        else {
          bVar2 = true;
          if (ret.code != Unmatched) {
            local_3a8 = p_Var7;
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar4 = ::std::operator<<(poVar4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar4 = ::std::operator<<(poVar4,":");
            poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
            poVar4 = ::std::operator<<(poVar4,"():");
            poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xcb5);
            ::std::operator<<(poVar4," ");
            ::std::__cxx11::string::string
                      ((string *)&local_2c8,"Parsing attribute `{}` failed. Error: {}",&local_3b1);
            fmt::format<char[13],std::__cxx11::string>
                      (&local_368,(fmt *)&local_2c8,(string *)"inputs:width",(char (*) [13])&ret.err
                       ,psVar9);
            poVar4 = ::std::operator<<((ostream *)&ss_e,(string *)&local_368);
            ::std::operator<<(poVar4,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            psVar9 = local_3b0;
            if (local_3b0 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+(&local_368,&local_2c8,psVar9);
              ::std::__cxx11::string::operator=((string *)psVar9,(string *)&local_368);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            bVar2 = false;
            iVar10 = 1;
            p_Var7 = local_3a8;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar2) goto LAB_001b8e39;
        ::std::__cxx11::string::string((string *)&local_d0,(string *)p_Var6);
        psVar9 = (string *)&ss_e;
        ::std::__cxx11::string::string((string *)psVar9,"inputs:intensity",(allocator *)&local_368);
        anon_unknown_0::ParseTypedAttribute<float>
                  (&ret,&table,&local_d0,prop,psVar9,&(light->super_BoundableLight).intensity);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar10 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          bVar2 = false;
          iVar10 = 3;
        }
        else {
          bVar2 = true;
          if (ret.code != Unmatched) {
            local_3a8 = p_Var7;
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar4 = ::std::operator<<(poVar4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar4 = ::std::operator<<(poVar4,":");
            poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
            poVar4 = ::std::operator<<(poVar4,"():");
            poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xcb7);
            ::std::operator<<(poVar4," ");
            ::std::__cxx11::string::string
                      ((string *)&local_2c8,"Parsing attribute `{}` failed. Error: {}",&local_3b1);
            fmt::format<char[17],std::__cxx11::string>
                      (&local_368,(fmt *)&local_2c8,(string *)"inputs:intensity",
                       (char (*) [17])&ret.err,psVar9);
            poVar4 = ::std::operator<<((ostream *)&ss_e,(string *)&local_368);
            ::std::operator<<(poVar4,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            psVar9 = local_3b0;
            if (local_3b0 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+(&local_368,&local_2c8,psVar9);
              ::std::__cxx11::string::operator=((string *)psVar9,(string *)&local_368);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            bVar2 = false;
            iVar10 = 1;
            p_Var7 = local_3a8;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar2) goto LAB_001b8e39;
        ::std::__cxx11::string::string((string *)&local_f0,(string *)p_Var6);
        ::std::__cxx11::string::string((string *)&ss_e,"extent",(allocator *)&local_368);
        args = prop;
        anon_unknown_0::ParseExtentAttribute
                  (&ret,&table,&local_f0,prop,(string *)&ss_e,&(light->super_BoundableLight).extent)
        ;
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar10 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          bVar2 = false;
          iVar10 = 3;
        }
        else {
          bVar2 = true;
          if (ret.code != Unmatched) {
            local_3a8 = p_Var7;
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar4 = ::std::operator<<(poVar4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar4 = ::std::operator<<(poVar4,":");
            poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
            poVar4 = ::std::operator<<(poVar4,"():");
            poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xcb8);
            ::std::operator<<(poVar4," ");
            ::std::__cxx11::string::string
                      ((string *)&local_2c8,"Parsing attribute `extent` failed. Error: {}",
                       &local_3b1);
            fmt::format<std::__cxx11::string>
                      ((string *)&local_368,(fmt *)&local_2c8,(string *)&ret.err,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
            poVar4 = ::std::operator<<((ostream *)&ss_e,(string *)&local_368);
            ::std::operator<<(poVar4,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            psVar9 = local_3b0;
            if (local_3b0 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_368,&local_2c8,psVar9);
              ::std::__cxx11::string::operator=((string *)psVar9,(string *)&local_368);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            bVar2 = false;
            iVar10 = 1;
            p_Var7 = local_3a8;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar2) goto LAB_001b8e39;
        bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)p_Var6,"visibility");
        if (bVar2) {
          ::std::__cxx11::string::string((string *)&ss_e,"visibility",(allocator *)&ret);
          sVar5 = ::std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count(&table,(key_type *)&ss_e);
          ::std::__cxx11::string::_M_dispose();
          if (sVar5 == 0) {
            Property::value_type_name_abi_cxx11_((string *)&ss_e,prop);
            tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
            _Var3 = ::std::operator==((string *)&ss_e,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&ret);
            if ((_Var3) && (uVar1 = *(uint *)((long)&(p_Var7 + 0x11)[6]._M_parent + 4), uVar1 < 2))
            {
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              if (uVar1 == 0) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                poVar4 = ::std::operator<<((ostream *)&ss_e,"[warn]");
                poVar4 = ::std::operator<<(poVar4,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                          );
                poVar4 = ::std::operator<<(poVar4,":");
                poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
                poVar4 = ::std::operator<<(poVar4,"():");
                poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xcba);
                ::std::operator<<(poVar4," ");
                poVar4 = ::std::operator<<((ostream *)&ss_e,"No value assigned to `");
                poVar4 = ::std::operator<<(poVar4,"visibility");
                poVar4 = ::std::operator<<(poVar4,"` token attribute. Set default token value.");
                ::std::operator<<(poVar4,"\n");
                psVar9 = local_3a0;
                if (local_3a0 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&ret,&local_368,local_3b0);
                  ::std::__cxx11::string::operator=((string *)psVar9,(string *)&ret);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                AttrMetas::operator=(&local_340->_metas,(AttrMetas *)(p_Var7 + 7));
                pcVar8 = "visibility";
LAB_001b8a8d:
                ::std::__cxx11::string::string((string *)&ss_e,pcVar8,(allocator *)&ret);
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&table,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &ss_e);
                ::std::__cxx11::string::_M_dispose();
                goto LAB_001b8e44;
              }
            }
            else {
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            _ss_e = VisibilityEnumHandler;
            local_298[0] = ::std::
                           _Function_handler<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                           ::_M_manager;
            ::std::__cxx11::string::string((string *)&ret,"visibility",(allocator *)&local_368);
            bVar2 = options->strict_allowedToken_check;
            ::std::
            function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::function((function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&local_110,
                       (function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&ss_e);
            bVar2 = ParseTimeSampledEnumProperty<tinyusdz::Visibility,tinyusdz::Visibility>
                              ((string *)&ret,bVar2,
                               (EnumHandlerFun<tinyusdz::Visibility> *)&local_110,(Attribute *)prop,
                               local_340,local_3a0,local_3b0);
            if (local_100 != (code *)0x0) {
              (*local_100)(&local_110,&local_110,__destroy_functor);
            }
            ::std::__cxx11::string::_M_dispose();
            iVar10 = 1;
            if (bVar2) {
              AttrMetas::operator=(&local_340->_metas,(AttrMetas *)(p_Var7 + 7));
              pcVar8 = "visibility";
LAB_001b8df8:
              ::std::__cxx11::string::string((string *)&ret,pcVar8,(allocator *)&local_368);
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&table,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret);
              ::std::__cxx11::string::_M_dispose();
              iVar10 = 3;
            }
LAB_001b8e1c:
            if (local_298[0] != (code *)0x0) {
              (*local_298[0])(&ss_e,&ss_e,3);
            }
            goto LAB_001b8e39;
          }
        }
        else {
          bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)p_Var6,"purpose");
          if (bVar2) {
            ::std::__cxx11::string::string((string *)&ss_e,"purpose",(allocator *)&ret);
            sVar5 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count(&table,(key_type *)&ss_e);
            ::std::__cxx11::string::_M_dispose();
            if (sVar5 == 0) {
              Property::value_type_name_abi_cxx11_((string *)&ss_e,prop);
              tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
              _Var3 = ::std::operator==((string *)&ss_e,
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&ret);
              if ((_Var3) && (uVar1 = *(uint *)((long)&(p_Var7 + 0x11)[6]._M_parent + 4), uVar1 < 2)
                 ) {
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                if (uVar1 == 0) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                  poVar4 = ::std::operator<<((ostream *)&ss_e,"[warn]");
                  poVar4 = ::std::operator<<(poVar4,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                            );
                  poVar4 = ::std::operator<<(poVar4,":");
                  poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
                  poVar4 = ::std::operator<<(poVar4,"():");
                  poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xcbc);
                  ::std::operator<<(poVar4," ");
                  poVar4 = ::std::operator<<((ostream *)&ss_e,"No value assigned to `");
                  poVar4 = ::std::operator<<(poVar4,"purpose");
                  poVar4 = ::std::operator<<(poVar4,"` token attribute. Set default token value.");
                  ::std::operator<<(poVar4,"\n");
                  psVar9 = local_3a0;
                  if (local_3a0 != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&ret,&local_368,local_3b0);
                    ::std::__cxx11::string::operator=((string *)psVar9,(string *)&ret);
                    ::std::__cxx11::string::_M_dispose();
                    ::std::__cxx11::string::_M_dispose();
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                  AttrMetas::operator=(&local_348->_metas,(AttrMetas *)(p_Var7 + 7));
                  pcVar8 = "purpose";
                  goto LAB_001b8a8d;
                }
              }
              else {
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
              }
              _ss_e = PurposeEnumHandler;
              local_298[0] = ::std::
                             _Function_handler<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                             ::_M_manager;
              ::std::__cxx11::string::string((string *)&ret,"purpose",(allocator *)&local_368);
              bVar2 = options->strict_allowedToken_check;
              ::std::
              function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::function((function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)&local_130,
                         (function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)&ss_e);
              bVar2 = ParseUniformEnumProperty<tinyusdz::Purpose,tinyusdz::Purpose>
                                ((string *)&ret,bVar2,
                                 (EnumHandlerFun<tinyusdz::Purpose> *)&local_130,(Attribute *)prop,
                                 local_348,local_3a0,local_3b0);
              if (local_120 != (code *)0x0) {
                (*local_120)(&local_130,&local_130,__destroy_functor);
              }
              ::std::__cxx11::string::_M_dispose();
              iVar10 = 1;
              if (bVar2) {
                AttrMetas::operator=(&local_348->_metas,(AttrMetas *)(p_Var7 + 7));
                pcVar8 = "purpose";
                goto LAB_001b8df8;
              }
              goto LAB_001b8e1c;
            }
          }
          else {
            sVar5 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count(&table,(key_type *)p_Var6);
            if (sVar5 == 0) {
              this = ::std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                     ::operator[](&(light->super_BoundableLight).props,(key_type *)p_Var6);
              Property::operator=(this,prop);
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&table,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var6
                        );
            }
            sVar5 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count(&table,(key_type *)p_Var6);
            if (sVar5 == 0) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
              poVar4 = ::std::operator<<((ostream *)&ss_e,"[warn]");
              poVar4 = ::std::operator<<(poVar4,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar4 = ::std::operator<<(poVar4,":");
              poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
              poVar4 = ::std::operator<<(poVar4,"():");
              poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xcbe);
              ::std::operator<<(poVar4," ");
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ret,"Unsupported/unimplemented property: ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               p_Var6);
              poVar4 = ::std::operator<<((ostream *)&ss_e,(string *)&ret);
              ::std::operator<<(poVar4,"\n");
              ::std::__cxx11::string::_M_dispose();
              psVar9 = local_3a0;
              if (local_3a0 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&ret,&local_368,local_3b0);
                ::std::__cxx11::string::operator=((string *)psVar9,(string *)&ret);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            }
          }
        }
      }
      else {
LAB_001b8e39:
        if ((iVar10 != 3) && (iVar10 != 0)) break;
      }
LAB_001b8e44:
      p_Var6 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var7);
      p_Var7 = p_Var6;
    }
  }
  else {
    local_394 = 0;
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&table);
  return SUB41(local_394,0);
}

Assistant:

bool ReconstructPrim<RectLight>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    RectLight *light,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)references;
  (void)options;

  std::set<std::string> table;

  if (!prim::ReconstructXformOpsFromProperties(spec, table, properties, &light->xformOps, err)) {
    return false;
  }

  for (const auto &prop : properties) {
    // PARSE_PROPERTY(prop, "inputs:colorTemperature", light->colorTemperature)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:texture:file", UsdUVTexture, light->file)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:color", RectLight, light->color)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:height", RectLight, light->height)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:width", RectLight, light->width)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:intensity", RectLight,
                   light->intensity)
    PARSE_EXTENT_ATTRIBUTE(table, prop, kExtent, RectLight, light->extent)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, kVisibility, Visibility, VisibilityEnumHandler, RectLight,
                   light->visibility, options.strict_allowedToken_check)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, kPurpose, Purpose, PurposeEnumHandler, RectLight,
                       light->purpose, options.strict_allowedToken_check)
    ADD_PROPERTY(table, prop, SphereLight, light->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}